

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O2

iterator __thiscall
QMultiMap<std::_List_iterator<QString>,_std::_List_iterator<Rule>_>::insert
          (QMultiMap<std::_List_iterator<QString>,_std::_List_iterator<Rule>_> *this,
          _List_iterator<QString> *key,_List_iterator<Rule> *value)

{
  iterator iVar1;
  long in_FS_OFFSET;
  pair<const_std::_List_iterator<QString>,_std::_List_iterator<Rule>_> local_38;
  QExplicitlySharedDataPointerV2<QMapData<std::multimap<std::_List_iterator<QString>,_std::_List_iterator<Rule>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<Rule>_>_>_>_>_>
  local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.d.ptr =
       (totally_ordered_wrapper<QMapData<std::multimap<std::_List_iterator<QString>,_std::_List_iterator<Rule>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<Rule>_>_>_>_>_*>
        )(this->d).d.ptr;
  if ((local_28.d.ptr ==
       (QMapData<std::multimap<std::_List_iterator<QString>,_std::_List_iterator<Rule>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<Rule>_>_>_>_>
        *)0x0) ||
     ((__atomic_base<int>)
      *(__int_type *)
       &(((QMapData<std::multimap<std::_List_iterator<QString>,_std::_List_iterator<Rule>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<Rule>_>_>_>_>
           *)local_28.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x1)) {
    local_28.d.ptr =
         (totally_ordered_wrapper<QMapData<std::multimap<std::_List_iterator<QString>,_std::_List_iterator<Rule>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<Rule>_>_>_>_>_*>
          )(QMapData<std::multimap<std::_List_iterator<QString>,_std::_List_iterator<Rule>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<Rule>_>_>_>_>
            *)0x0;
  }
  else {
    LOCK();
    (((QMapData<std::multimap<std::_List_iterator<QString>,_std::_List_iterator<Rule>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<Rule>_>_>_>_>
       *)local_28.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value =
         (Type)((int)(((QMapData<std::multimap<std::_List_iterator<QString>,_std::_List_iterator<Rule>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<Rule>_>_>_>_>
                        *)local_28.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
                     super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  detach(this);
  iVar1 = std::
          _Rb_tree<std::_List_iterator<QString>,_std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<Rule>_>,_std::_Select1st<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<Rule>_>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<Rule>_>_>_>
          ::lower_bound(&(((this->d).d.ptr)->m)._M_t,key);
  local_38.first = (_List_iterator<QString>)key->_M_node;
  local_38.second = (_List_iterator<Rule>)value->_M_node;
  iVar1 = std::
          _Rb_tree<std::_List_iterator<QString>,std::pair<std::_List_iterator<QString>const,std::_List_iterator<Rule>>,std::_Select1st<std::pair<std::_List_iterator<QString>const,std::_List_iterator<Rule>>>,std::less<std::_List_iterator<QString>>,std::allocator<std::pair<std::_List_iterator<QString>const,std::_List_iterator<Rule>>>>
          ::_M_insert_equal_<std::pair<std::_List_iterator<QString>const,std::_List_iterator<Rule>>>
                    ((_Rb_tree<std::_List_iterator<QString>,std::pair<std::_List_iterator<QString>const,std::_List_iterator<Rule>>,std::_Select1st<std::pair<std::_List_iterator<QString>const,std::_List_iterator<Rule>>>,std::less<std::_List_iterator<QString>>,std::allocator<std::pair<std::_List_iterator<QString>const,std::_List_iterator<Rule>>>>
                      *)&((this->d).d.ptr)->m,iVar1._M_node,&local_38);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::multimap<std::_List_iterator<QString>,_std::_List_iterator<Rule>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<Rule>_>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)(iterator)iVar1._M_node;
  }
  __stack_chk_fail();
}

Assistant:

iterator insert(const Key &key, const T &value)
    {
        const auto copy = d.isShared() ? *this : QMultiMap(); // keep `key`/`value` alive across the detach
        detach();
        // note that std::multimap inserts at the end of an equal_range for a key,
        // QMultiMap at the beginning.
        auto i = d->m.lower_bound(key);
        return iterator(d->m.insert(i, {key, value}));
    }